

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

int Gia_ManBmcAssignVarIds(Bmc_Mna_t *p,Vec_Int_t *vIns,Vec_Int_t *vUsed,Vec_Int_t *vOuts)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  iVar8 = vIns->nSize;
  if (0 < iVar8) {
    piVar2 = vIns->pArray;
    pVVar3 = p->vId2Var;
    lVar9 = 0;
    do {
      lVar10 = (long)piVar2[lVar9];
      if ((lVar10 < 0) || (pVVar3->nSize <= piVar2[lVar9])) goto LAB_0056e594;
      piVar4 = pVVar3->pArray;
      if (piVar4[lVar10] == 0) {
        iVar8 = p->nSatVars;
        p->nSatVars = iVar8 + 1;
        piVar4[lVar10] = iVar8;
        iVar8 = vIns->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar8);
  }
  uVar7 = (long)vUsed->nSize;
  if (0 < (long)vUsed->nSize) {
    do {
      if ((long)vUsed->nSize < (long)uVar7) goto LAB_0056e594;
      lVar9 = (long)vUsed->pArray[uVar7 - 1];
      if ((lVar9 < 0) || (p->vId2Var->nSize <= vUsed->pArray[uVar7 - 1])) goto LAB_0056e594;
      piVar2 = p->vId2Var->pArray;
      if (piVar2[lVar9] != 0) {
        __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                      ,0x1db,
                      "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar8 = p->nSatVars;
      p->nSatVars = iVar8 + 1;
      piVar2[lVar9] = iVar8;
      bVar5 = 1 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar5);
  }
  if (0 < vOuts->nSize) {
    piVar2 = vOuts->pArray;
    pVVar3 = p->vId2Var;
    lVar9 = 0;
    do {
      lVar10 = (long)piVar2[lVar9];
      if ((lVar10 < 0) || (pVVar3->nSize <= piVar2[lVar9])) {
LAB_0056e594:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = pVVar3->pArray;
      if (piVar4[lVar10] != 0) {
        __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                      ,0x1e0,
                      "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar8 = p->nSatVars;
      p->nSatVars = iVar8 + 1;
      piVar4[lVar10] = iVar8;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vOuts->nSize);
  }
  iVar8 = p->nSatVars;
  iVar6 = sat_solver_nvars(p->pSat);
  if (iVar6 < iVar8) {
    sat_solver_setnvars(p->pSat,p->nSatVars);
  }
  return iVar1;
}

Assistant:

int Gia_ManBmcAssignVarIds( Bmc_Mna_t * p, Vec_Int_t * vIns, Vec_Int_t * vUsed, Vec_Int_t * vOuts )
{
    int i, iObj = 0, VarC0 = p->nSatVars++;
    Vec_IntForEachEntry( vIns, iObj, i )
        if ( Vec_IntEntry( p->vId2Var, iObj ) == 0 )
            Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    Vec_IntForEachEntryReverse( vUsed, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    Vec_IntForEachEntry( vOuts, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    // extend the SAT solver
    if ( p->nSatVars > sat_solver_nvars(p->pSat) )
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return VarC0;
}